

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

Inst * __thiscall mir::inst::PtrOffsetInst::deep_copy(PtrOffsetInst *this)

{
  Value *val;
  Value *in_RDI;
  Value *in_stack_ffffffffffffffd8;
  VarId *in_stack_ffffffffffffffe0;
  VarId *in_stack_ffffffffffffffe8;
  PtrOffsetInst *in_stack_fffffffffffffff0;
  
  val = (Value *)operator_new(0x48);
  VarId::VarId((VarId *)in_RDI,(VarId *)val);
  VarId::VarId((VarId *)in_RDI,(VarId *)val);
  Value::Value(in_RDI,val);
  PtrOffsetInst(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                in_stack_ffffffffffffffd8);
  return (Inst *)val;
}

Assistant:

Inst* deep_copy() { return new PtrOffsetInst(dest, ptr, offset); }